

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O3

void blake256_compress(state_conflict *S,uint8_t *block)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t m [16];
  uint local_104;
  uint local_f4;
  ulong local_e0;
  uint local_d4;
  uint local_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint auStack_78 [16];
  state_conflict *local_38;
  
  lVar2 = 0;
  do {
    uVar1 = *(uint *)(block + lVar2 * 4);
    auStack_78[lVar2] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  local_b8 = *(undefined8 *)S->h;
  uStack_b0 = *(ulong *)(S->h + 2);
  local_a8 = *(undefined8 *)(S->h + 4);
  uStack_a0 = *(undefined8 *)(S->h + 6);
  if (S->nullt == 0) {
    local_88 = S->t[0] ^ 0xa4093822;
    local_84 = S->t[0] ^ 0x299f31d0;
    local_80 = S->t[1] ^ 0x82efa98;
    local_f4 = S->t[1] ^ 0xec4e6c89;
  }
  else {
    local_88 = 0xa4093822;
    local_84 = 0x299f31d0;
    local_80 = 0x82efa98;
    local_f4 = 0xec4e6c89;
  }
  local_d4 = S->s[0] ^ 0x243f6a88;
  local_d0 = S->s[1] ^ 0x85a308d3;
  local_90 = S->s[2] ^ 0x13198a2e;
  local_38 = S;
  local_8c = S->s[3] ^ 0x3707344;
  local_b8._4_4_ = (uint)((ulong)local_b8 >> 0x20);
  local_a8._4_4_ = (uint)((ulong)local_a8 >> 0x20);
  local_e0 = uStack_b0 & 0xffffffff;
  uStack_a0._4_4_ = (uint)((ulong)uStack_a0 >> 0x20);
  lVar2 = 0xf;
  uStack_b0._4_4_ = (uint)(uStack_b0 >> 0x20);
  local_104 = uStack_b0._4_4_;
  do {
    uVar1 = (uint)local_b8 + (uint)local_a8 +
            (cst[(byte)(&UNK_0018e0e2)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0e1)[lVar2]]);
    uVar6 = local_b8._4_4_ + local_a8._4_4_ +
            (cst[(byte)(&UNK_0018e0e4)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0e3)[lVar2]]);
    uVar12 = (int)local_e0 + (uint)uStack_a0 +
             (cst[(byte)(&UNK_0018e0e6)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0e5)[lVar2]]);
    local_88 = local_88 ^ uVar1;
    local_84 = local_84 ^ uVar6;
    uVar5 = local_104 + uStack_a0._4_4_ +
            (cst[(byte)(&UNK_0018e0e8)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0e7)[lVar2]]);
    local_80 = local_80 ^ uVar12;
    local_f4 = local_f4 ^ uVar5;
    uVar8 = local_80 << 0x10 | local_80 >> 0x10;
    local_90 = local_90 + uVar8;
    uVar7 = local_f4 << 0x10 | local_f4 >> 0x10;
    uStack_a0._0_4_ = (uint)uStack_a0 ^ local_90;
    local_8c = local_8c + uVar7;
    uStack_a0._4_4_ = uStack_a0._4_4_ ^ local_8c;
    uVar4 = (uint)uStack_a0 << 0x14 | (uint)uStack_a0 >> 0xc;
    uVar3 = uStack_a0._4_4_ << 0x14 | uStack_a0._4_4_ >> 0xc;
    uVar5 = (cst[(byte)(&UNK_0018e0e7)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0e8)[lVar2]]) + uVar5 +
            uVar3;
    uVar7 = uVar7 ^ uVar5;
    uVar12 = (cst[(byte)(&UNK_0018e0e5)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0e6)[lVar2]]) + uVar12
             + uVar4;
    uVar8 = uVar8 ^ uVar12;
    uVar10 = local_88 << 0x10 | local_88 >> 0x10;
    local_d4 = local_d4 + uVar10;
    local_a8._0_4_ = (uint)local_a8 ^ local_d4;
    uVar13 = (uint)local_a8 << 0x14 | (uint)local_a8 >> 0xc;
    uVar1 = (cst[(byte)(&UNK_0018e0e1)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0e2)[lVar2]]) + uVar1 +
            uVar13;
    uVar10 = uVar10 ^ uVar1;
    uVar11 = uVar10 << 0x18 | uVar10 >> 8;
    local_d4 = local_d4 + uVar11;
    uVar13 = uVar13 ^ local_d4;
    uVar9 = uVar8 << 0x18 | uVar8 >> 8;
    uVar14 = uVar13 << 0x19 | uVar13 >> 7;
    local_90 = local_90 + uVar9;
    uVar8 = (cst[sigma[0][lVar2]] ^ auStack_78[(byte)(&UNK_0018e0ef)[lVar2]]) + uVar5 + uVar14;
    uVar9 = uVar9 ^ uVar8;
    uVar10 = local_84 << 0x10 | local_84 >> 0x10;
    local_d0 = local_d0 + uVar10;
    local_a8._4_4_ = local_a8._4_4_ ^ local_d0;
    uVar13 = local_a8._4_4_ << 0x14 | local_a8._4_4_ >> 0xc;
    uVar5 = (cst[(byte)(&UNK_0018e0e3)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0e4)[lVar2]]) + uVar6 +
            uVar13;
    uVar10 = uVar10 ^ uVar5;
    uVar10 = uVar10 << 0x18 | uVar10 >> 8;
    uVar6 = uVar7 << 0x18 | uVar7 >> 8;
    local_8c = local_8c + uVar6;
    uVar3 = uVar3 ^ local_8c;
    uVar3 = uVar3 << 0x19 | uVar3 >> 7;
    local_d0 = local_d0 + uVar10;
    uVar12 = (cst[(byte)(&UNK_0018e0ee)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0ed)[lVar2]]) + uVar12
             + uVar3;
    uVar10 = uVar10 ^ uVar12;
    uVar13 = uVar13 ^ local_d0;
    uVar13 = uVar13 << 0x19 | uVar13 >> 7;
    uVar1 = (cst[(byte)(&UNK_0018e0ea)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0e9)[lVar2]]) + uVar1 +
            uVar13;
    uVar6 = uVar6 ^ uVar1;
    uVar4 = uVar4 ^ local_90;
    uVar4 = uVar4 << 0x19 | uVar4 >> 7;
    uVar5 = (cst[(byte)(&UNK_0018e0ec)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0eb)[lVar2]]) + uVar5 +
            uVar4;
    uVar11 = uVar11 ^ uVar5;
    uVar9 = uVar9 << 0x10 | uVar9 >> 0x10;
    local_d0 = local_d0 + uVar9;
    uVar14 = uVar14 ^ local_d0;
    uVar14 = uVar14 << 0x14 | uVar14 >> 0xc;
    uVar7 = uVar10 << 0x10 | uVar10 >> 0x10;
    local_d4 = local_d4 + uVar7;
    local_104 = (cst[(byte)(&UNK_0018e0ef)[lVar2]] ^ auStack_78[sigma[0][lVar2]]) + uVar8 + uVar14;
    uVar3 = uVar3 ^ local_d4;
    uVar3 = uVar3 << 0x14 | uVar3 >> 0xc;
    uVar9 = uVar9 ^ local_104;
    uVar12 = (cst[(byte)(&UNK_0018e0ed)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0ee)[lVar2]]) + uVar12
             + uVar3;
    uVar6 = uVar6 << 0x10 | uVar6 >> 0x10;
    local_e0 = (ulong)uVar12;
    uVar7 = uVar7 ^ uVar12;
    local_90 = local_90 + uVar6;
    uVar13 = uVar13 ^ local_90;
    local_80 = uVar9 << 0x18 | uVar9 >> 8;
    uVar8 = uVar13 << 0x14 | uVar13 >> 0xc;
    local_84 = uVar7 << 0x18 | uVar7 >> 8;
    local_d0 = local_d0 + local_80;
    local_b8._0_4_ =
         (cst[(byte)(&UNK_0018e0e9)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0ea)[lVar2]]) + uVar1 +
         uVar8;
    uVar6 = uVar6 ^ (uint)local_b8;
    local_d4 = local_d4 + local_84;
    local_f4 = uVar6 << 0x18 | uVar6 >> 8;
    local_90 = local_90 + local_f4;
    uVar14 = uVar14 ^ local_d0;
    uVar6 = uVar11 << 0x10 | uVar11 >> 0x10;
    local_8c = local_8c + uVar6;
    uVar3 = uVar3 ^ local_d4;
    uVar4 = uVar4 ^ local_8c;
    uVar1 = uVar4 << 0x14 | uVar4 >> 0xc;
    uVar8 = uVar8 ^ local_90;
    local_b8._4_4_ =
         (cst[(byte)(&UNK_0018e0eb)[lVar2]] ^ auStack_78[(byte)(&UNK_0018e0ec)[lVar2]]) + uVar5 +
         uVar1;
    uVar6 = uVar6 ^ local_b8._4_4_;
    local_a8._0_4_ = uVar14 << 0x19 | uVar14 >> 7;
    local_88 = uVar6 << 0x18 | uVar6 >> 8;
    uStack_a0._4_4_ = uVar3 << 0x19 | uVar3 >> 7;
    local_8c = local_8c + local_88;
    uVar1 = uVar1 ^ local_8c;
    local_a8._4_4_ = uVar8 << 0x19 | uVar8 >> 7;
    uStack_a0._0_4_ = uVar1 << 0x19 | uVar1 >> 7;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0xef);
  local_98 = local_d4;
  local_94 = local_d0;
  uStack_b0 = CONCAT44(local_104,uVar12);
  local_7c = local_f4;
  lVar2 = 0;
  do {
    S->h[(uint)lVar2 & 7] = S->h[(uint)lVar2 & 7] ^ *(uint *)((long)&local_b8 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  lVar2 = 0;
  do {
    S->h[lVar2] = S->h[lVar2] ^ S->s[(uint)lVar2 & 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

void blake256_compress(state *S, const uint8_t *block) {
    uint32_t v[16], m[16], i;

#define ROT(x,n) (((x)<<(32-n))|((x)>>(n)))
#define G(a,b,c,d,e)                                      \
    v[a] += (m[sigma[i][e]] ^ cst[sigma[i][e+1]]) + v[b]; \
    v[d] = ROT(v[d] ^ v[a],16);                           \
    v[c] += v[d];                                         \
    v[b] = ROT(v[b] ^ v[c],12);                           \
    v[a] += (m[sigma[i][e+1]] ^ cst[sigma[i][e]])+v[b];   \
    v[d] = ROT(v[d] ^ v[a], 8);                           \
    v[c] += v[d];                                         \
    v[b] = ROT(v[b] ^ v[c], 7);

    for (i = 0; i < 16; ++i) m[i] = U8TO32(block + i * 4);
    for (i = 0; i < 8;  ++i) v[i] = S->h[i];
    v[ 8] = S->s[0] ^ 0x243F6A88;
    v[ 9] = S->s[1] ^ 0x85A308D3;
    v[10] = S->s[2] ^ 0x13198A2E;
    v[11] = S->s[3] ^ 0x03707344;
    v[12] = 0xA4093822;
    v[13] = 0x299F31D0;
    v[14] = 0x082EFA98;
    v[15] = 0xEC4E6C89;

    if (S->nullt == 0) {
        v[12] ^= S->t[0];
        v[13] ^= S->t[0];
        v[14] ^= S->t[1];
        v[15] ^= S->t[1];
    }

    for (i = 0; i < 14; ++i) {
        G(0, 4,  8, 12,  0);
        G(1, 5,  9, 13,  2);
        G(2, 6, 10, 14,  4);
        G(3, 7, 11, 15,  6);
        G(3, 4,  9, 14, 14);
        G(2, 7,  8, 13, 12);
        G(0, 5, 10, 15,  8);
        G(1, 6, 11, 12, 10);
    }

    for (i = 0; i < 16; ++i) S->h[i % 8] ^= v[i];
    for (i = 0; i < 8;  ++i) S->h[i] ^= S->s[i % 4];
}